

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O3

bool __thiscall
HighsHashTree<int,_void>::InnerLeaf<3>::erase_entry
          (InnerLeaf<3> *this,uint64_t fullHash,int hashPos,int *key)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  difference_type __d_2;
  long lVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  difference_type __d;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  uVar7 = fullHash >> ((char)hashPos * -6 + 0x30U & 0x3f);
  uVar2 = (uVar7 & 0xffff) >> 10;
  uVar4 = (this->occupation).occupation;
  if ((uVar4 >> uVar2 & 1) != 0) {
    lVar11 = POPCOUNT(uVar4 >> (sbyte)uVar2);
    lVar5 = 0;
    lVar6 = 0;
    do {
      lVar13 = lVar6;
      lVar5 = lVar5 + -0x100000000;
      lVar6 = lVar13 + 1;
    } while ((ushort)uVar2 < (ushort)((ushort)(this->hashes)._M_elems[lVar11 + lVar13 + -1] >> 10));
    uVar7 = uVar7 & 0xffff;
    iVar8 = 1;
    do {
      iVar8 = iVar8 + -1;
      lVar12 = lVar6 + 1;
      lVar5 = lVar5 + -0x100000000;
      lVar9 = lVar6 + -2;
      lVar6 = lVar12;
    } while (uVar7 < (this->hashes)._M_elems[lVar11 + lVar9]);
    iVar1 = this->size;
    iVar10 = (int)lVar11;
    if ((iVar1 - iVar10) + 3 != (int)lVar12) {
      do {
        if ((this->hashes)._M_elems[lVar11 + lVar12 + -3] != uVar7) {
          return false;
        }
        if (*key == (this->entries)._M_elems[lVar11 + lVar12 + -3].value_) {
          iVar3 = iVar1 + -1;
          this->size = iVar3;
          if (iVar10 + (int)lVar12 + -3 < iVar3) {
            lVar9 = ((lVar11 << 0x20) + -0x200000000) - lVar5;
            lVar6 = lVar9 >> 0x20;
            lVar5 = ((lVar11 << 0x20) - lVar5) + -0x300000000 >> 0x20;
            if (lVar6 != iVar1) {
              lVar9 = lVar9 >> 0x1e;
              memmove((this->entries)._M_elems + lVar5,
                      (void *)((long)&(this->entries)._M_elems[0].value_ + lVar9),
                      (long)iVar1 * 4 - lVar9);
              iVar3 = this->size;
            }
            memmove((this->hashes)._M_elems + lVar5,(this->hashes)._M_elems + lVar6,
                    (long)(((iVar3 - iVar10) - (int)lVar12) + 3) << 3);
            if ((ushort)((ushort)(this->hashes)._M_elems[lVar11 + lVar13 + -1] >> 10) ==
                (ushort)uVar2) goto LAB_0026f9b0;
            uVar4 = (this->occupation).occupation;
          }
          else if (iVar8 != 0) goto LAB_0026f9b0;
          (this->occupation).occupation = uVar4 ^ 1L << (sbyte)uVar2;
LAB_0026f9b0:
          (this->hashes)._M_elems[this->size] = 0;
          return true;
        }
        lVar5 = lVar5 + -0x100000000;
        lVar12 = lVar12 + 1;
        iVar8 = iVar8 + -1;
      } while ((iVar10 - iVar1) + -3 + (int)lVar12 != 0);
    }
  }
  return false;
}

Assistant:

bool erase_entry(uint64_t fullHash, int hashPos, const K& key) {
      uint16_t hash = get_hash_chunks16(fullHash, hashPos);
      uint8_t hashChunk = get_first_chunk16(hash);
      if (!occupation.test(hashChunk)) return false;

      int startPos = occupation.num_set_until(hashChunk) - 1;
      while (get_first_chunk16(hashes[startPos]) > hashChunk) ++startPos;

      int pos = startPos;
      while (hashes[pos] > hash) ++pos;

      if (!find_key(key, hash, pos)) return false;

      --size;
      if (pos < size) {
        std::move(std::next(entries.begin(), pos + 1),
                  std::next(entries.begin(), size + 1),
                  std::next(entries.begin(), pos));
        memmove(&hashes[pos], &hashes[pos + 1],
                sizeof(hashes[0]) * (size - pos));
        if (get_first_chunk16(hashes[startPos]) != hashChunk)
          occupation.flip(hashChunk);
      } else if (startPos == pos)
        occupation.flip(hashChunk);

      hashes[size] = 0;
      return true;
    }